

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::BuildFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,
          string *code_ptr)

{
  bool bVar1;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  byte local_10a;
  byte local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string field_ty;
  undefined1 local_78 [8];
  string field_method;
  string field_var;
  string *code;
  string *code_ptr_local;
  size_t offset_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Variable_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_78,&(this->namer_).super_Namer,field);
  GenFieldTy_abi_cxx11_((string *)((long)&name.field_2 + 8),this,field);
  local_109 = 0;
  local_10a = 0;
  if (((((this->super_BaseGenerator).parser_)->opts).python_no_type_prefix_suffix & 1U) == 0) {
    IdlNamer::Type_abi_cxx11_(&local_108,&this->namer_,struct_def);
    local_109 = 1;
    std::operator+(&local_e8,&local_108,"Add");
    local_10a = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "Add",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
  }
  if ((local_10a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_109 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::operator+(&local_130,"def ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  if (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0) {
    std::operator+(&local_1b0,"(builder, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    std::operator+(&local_190,"(builder: flatbuffers.Builder, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_170,&local_190,": ");
    std::operator+(&local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name.field_2 + 8));
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::__cxx11::string::operator+=((string *)code_ptr,"):\n");
  std::operator+(&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,"builder.Prepend");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  GenMethod_abi_cxx11_(&local_210,this,field);
  std::operator+(&local_1f0,&local_210,"Slot(");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  NumToString<unsigned_long>(&local_250,offset);
  std::operator+(&local_230,&local_250,", ");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = IsScalar((field->value).type.base_type);
  if ((bVar1) || ((struct_def->fixed & 1U) != 0)) {
    std::__cxx11::string::operator+=
              ((string *)code_ptr,(string *)(field_method.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)code_ptr,"flatbuffers.number_types.UOffsetTFlags.py_type");
    std::operator+(&local_290,"(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_method.field_2 + 8));
    std::operator+(&local_270,&local_290,")");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::operator+=((string *)code_ptr,", ");
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)code_ptr,"None");
  }
  else {
    bVar1 = IsFloat((field->value).type.base_type);
    if (bVar1) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (&local_2b0,&(this->float_const_gen_).super_FloatConstantGenerator,field);
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    else {
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&(field->value).constant);
    }
  }
  std::__cxx11::string::operator+=((string *)code_ptr,")\n\n");
  if ((((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) &&
     (((((this->super_BaseGenerator).parser_)->opts).python_no_type_prefix_suffix & 1U) == 0)) {
    std::operator+(&local_2d0,"def Add",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0) {
      std::operator+(&local_350,"(builder, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_350);
      std::__cxx11::string::~string((string *)&local_350);
    }
    else {
      std::operator+(&local_330,"(builder: flatbuffers.Builder, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_method.field_2 + 8));
      std::operator+(&local_310,&local_330,": ");
      std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
    }
    std::__cxx11::string::operator+=((string *)code_ptr,"):\n");
    IdlNamer::Type_abi_cxx11_(&local_3d0,&this->namer_,struct_def);
    std::operator+(&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,&local_3d0);
    std::operator+(&local_390,&local_3b0,"Add");
    std::operator+(&local_370,&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::operator+=((string *)code_ptr,"(builder, ");
    std::__cxx11::string::operator+=
              ((string *)code_ptr,(string *)(field_method.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)code_ptr,")\n\n");
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) const {
    auto &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    const std::string field_method = namer_.Method(field);
    const std::string field_ty = GenFieldTy(field);

    const auto name = parser_.opts.python_no_type_prefix_suffix
                          ? "Add" + field_method
                          : namer_.Type(struct_def) + "Add" + field_method;

    // Generate method with struct name.
    code += "def " + name;
    if (parser_.opts.python_typing) {
      code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
    } else {
      code += "(builder, " + field_var;
    }
    code += "):\n";
    code += Indent + "builder.Prepend";
    code += GenMethod(field) + "Slot(";
    code += NumToString(offset) + ", ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.number_types.UOffsetTFlags.py_type";
      code += "(" + field_var + ")";
    } else {
      code += field_var;
    }
    code += ", ";
    if (field.IsScalarOptional()) {
      code += "None";
    } else if (IsFloat(field.value.type.base_type)) {
      code += float_const_gen_.GenFloatConstant(field);
    } else {
      code += field.value.constant;
    }
    code += ")\n\n";

    if (!parser_.opts.one_file && !parser_.opts.python_no_type_prefix_suffix) {
      // Generate method without struct name.
      code += "def Add" + field_method;
      if (parser_.opts.python_typing) {
        code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
      } else {
        code += "(builder, " + field_var;
      }
      code += "):\n";
      code += Indent + namer_.Type(struct_def) + "Add" + field_method;
      code += "(builder, ";
      code += field_var;
      code += ")\n\n";
    }
  }